

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_query_node.cpp
# Opt level: O1

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::RecursiveCTENode::Deserialize(RecursiveCTENode *this,Deserializer *deserializer)

{
  undefined1 uVar1;
  uint uVar2;
  RecursiveCTENode *this_00;
  pointer pRVar4;
  byte bVar5;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var6;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var7;
  undefined4 uVar8;
  undefined4 uVar9;
  unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true> result;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  __tmp;
  _Head_base<0UL,_duckdb::RecursiveCTENode_*,_false> local_70;
  undefined1 local_68 [12];
  undefined4 uStack_5c;
  pointer local_58;
  pointer local_48;
  pointer ppStack_40;
  pointer local_38;
  int iVar3;
  
  this_00 = (RecursiveCTENode *)operator_new(0xe0);
  QueryNode::QueryNode((QueryNode *)this_00,RECURSIVE_CTE_NODE);
  (this_00->super_QueryNode)._vptr_QueryNode = (_func_int **)&PTR__RecursiveCTENode_0247e268;
  (this_00->ctename)._M_dataplus._M_p = (pointer)&(this_00->ctename).field_2;
  (this_00->ctename)._M_string_length = 0;
  (this_00->ctename).field_2._M_local_buf[0] = '\0';
  (this_00->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  (this_00->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
  .super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false> =
       (_Head_base<0UL,_duckdb::QueryNode_*,_false>)0x0;
  (this_00->aliases).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->aliases).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->aliases).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->key_targets).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->key_targets).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->key_targets).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70._M_head_impl = this_00;
  pRVar4 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_70);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"cte_name");
  if ((char)uVar2 == '\0') {
    stack0xffffffffffffffa0 = (pointer)0x0;
    local_58 = (pointer)((ulong)local_58 & 0xffffffffffffff00);
    local_68._0_8_ = (QueryNode *)&stack0xffffffffffffffa8;
    ::std::__cxx11::string::operator=((string *)&pRVar4->ctename,(string *)local_68);
    if ((QueryNode *)local_68._0_8_ != (QueryNode *)&stack0xffffffffffffffa8) goto LAB_01778644;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_68,deserializer);
    ::std::__cxx11::string::operator=((string *)&pRVar4->ctename,(string *)local_68);
    if ((QueryNode *)local_68._0_8_ != (QueryNode *)&stack0xffffffffffffffa8) {
LAB_01778644:
      operator_delete((void *)local_68._0_8_);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pRVar4 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_70);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"union_all");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  pRVar4->union_all = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pRVar4 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_70);
  iVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"left");
  bVar5 = (byte)iVar3;
  if (bVar5 == 0) {
    _Var6._M_head_impl =
         (pRVar4->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
         ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pRVar4->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
    .super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    if (_Var6._M_head_impl != (QueryNode *)0x0) goto LAB_0177873a;
    bVar5 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar3 == '\0') {
      _Var7._M_head_impl = (QueryNode *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      QueryNode::Deserialize((QueryNode *)local_68,deserializer);
      _Var7._M_head_impl = (QueryNode *)local_68._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var6._M_head_impl =
         (pRVar4->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
         ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pRVar4->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
    .super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var7._M_head_impl;
    if (_Var6._M_head_impl == (QueryNode *)0x0) {
      bVar5 = 1;
    }
    else {
LAB_0177873a:
      (*(_Var6._M_head_impl)->_vptr_QueryNode[1])();
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar5);
  pRVar4 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_70);
  iVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"right");
  bVar5 = (byte)iVar3;
  if (bVar5 == 0) {
    _Var6._M_head_impl =
         (pRVar4->right).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pRVar4->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    if (_Var6._M_head_impl == (QueryNode *)0x0) {
      bVar5 = 0;
      goto LAB_017787f8;
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar3 == '\0') {
      _Var7._M_head_impl = (QueryNode *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      QueryNode::Deserialize((QueryNode *)local_68,deserializer);
      _Var7._M_head_impl = (QueryNode *)local_68._0_8_;
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var6._M_head_impl =
         (pRVar4->right).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pRVar4->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var7._M_head_impl;
    if (_Var6._M_head_impl == (QueryNode *)0x0) {
      bVar5 = 1;
      goto LAB_017787f8;
    }
  }
  (*(_Var6._M_head_impl)->_vptr_QueryNode[1])();
LAB_017787f8:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar5);
  pRVar4 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_70);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xcc,"aliases",&pRVar4->aliases);
  pRVar4 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_70);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcd,"key_targets");
  if ((char)uVar2 == '\0') {
    local_48 = (pointer)0x0;
    ppStack_40 = (pointer)0x0;
    local_38 = (pointer)0x0;
    local_68._0_4_ =
         *(undefined4 *)
          &(pRVar4->key_targets).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    local_68._4_4_ =
         *(undefined4 *)
          ((long)&(pRVar4->key_targets).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4);
    uVar8 = *(undefined4 *)
             &(pRVar4->key_targets).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar9 = *(undefined4 *)
             ((long)&(pRVar4->key_targets).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 4);
    local_58 = (pRVar4->key_targets).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    Deserializer::
    Read<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((type *)&stack0xffffffffffffffb8,deserializer);
    local_68._0_4_ =
         *(undefined4 *)
          &(pRVar4->key_targets).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    local_68._4_4_ =
         *(undefined4 *)
          ((long)&(pRVar4->key_targets).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4);
    uVar8 = *(undefined4 *)
             &(pRVar4->key_targets).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar9 = *(undefined4 *)
             ((long)&(pRVar4->key_targets).
                     super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 4);
    local_58 = (pRVar4->key_targets).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  (pRVar4->key_targets).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_48;
  (pRVar4->key_targets).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppStack_40;
  (pRVar4->key_targets).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_38;
  stack0xffffffffffffffa0 = (pointer)CONCAT44(uVar9,uVar8);
  local_48 = (pointer)0x0;
  ppStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)local_68);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)&stack0xffffffffffffffb8);
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  (this->super_QueryNode)._vptr_QueryNode = (_func_int **)local_70._M_head_impl;
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> RecursiveCTENode::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<RecursiveCTENode>(new RecursiveCTENode());
	deserializer.ReadPropertyWithDefault<string>(200, "cte_name", result->ctename);
	deserializer.ReadPropertyWithExplicitDefault<bool>(201, "union_all", result->union_all, false);
	deserializer.ReadPropertyWithDefault<unique_ptr<QueryNode>>(202, "left", result->left);
	deserializer.ReadPropertyWithDefault<unique_ptr<QueryNode>>(203, "right", result->right);
	deserializer.ReadPropertyWithDefault<vector<string>>(204, "aliases", result->aliases);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(205, "key_targets", result->key_targets);
	return std::move(result);
}